

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O0

void benchmark<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::vector<float,remora::cpu_tag>>
               (matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *image,vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag>
                       *filter,size_t num_channels,size_t num_filters,size_t image_size1,
               size_t image_size2,size_t filter_size)

{
  undefined1 auVar1 [16];
  unsigned_long uVar2;
  matrix<float,_remora::row_major,_remora::cpu_tag> *pmVar3;
  size_type sVar4;
  unsigned_long *padding_width;
  long lVar5;
  ostream *poVar6;
  ulong in_RCX;
  ulong in_RDX;
  matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  long in_R8;
  long in_R9;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Timer *in_stack_00000008;
  double flops;
  double mults;
  Timer time;
  size_t i;
  double minOptTime;
  matrix<float,_remora::row_major,_remora::cpu_tag> out;
  size_t output_size2;
  size_t output_size1;
  long in_stack_fffffffffffffe78;
  undefined1 measureWallclockTime;
  Timer *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffea8;
  size_type in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffeb8;
  matrix<float,_remora::row_major,_remora::cpu_tag> *in_stack_fffffffffffffec0;
  vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffec8;
  matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  double *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  double local_c0 [6];
  unsigned_long local_90 [3];
  double local_78;
  undefined4 local_6c;
  long local_40;
  ulong local_38;
  long local_30;
  ulong local_20;
  ulong local_18;
  matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_8;
  
  local_38 = (in_R8 - (long)in_stack_00000008) + 1;
  local_40 = (in_R9 - (long)in_stack_00000008) + 1;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  pmVar3 = remora::
           matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(in_RDI);
  remora::matrix<float,_remora::row_major,_remora::cpu_tag>::size1(pmVar3);
  local_6c = 0;
  remora::matrix<float,_remora::row_major,_remora::cpu_tag>::matrix
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  local_78 = std::numeric_limits<double>::max();
  local_90[2] = 0;
  while( true ) {
    uVar2 = local_90[2];
    measureWallclockTime = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
    local_90[1] = 1;
    pmVar3 = remora::
             matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
             ::operator()(local_8);
    sVar4 = remora::matrix<float,_remora::row_major,_remora::cpu_tag>::size1(pmVar3);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar4;
    local_90[0] = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x14)) / auVar1,0);
    padding_width = std::max<unsigned_long>(local_90 + 1,local_90);
    if (uVar2 == *padding_width) break;
    Timer::Timer(in_stack_fffffffffffffe80,(bool)measureWallclockTime);
    in_stack_fffffffffffffe78 = local_30;
    in_stack_fffffffffffffe80 = in_stack_00000008;
    remora::kernels::
    conv2d<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::vector<float,remora::cpu_tag>,remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               (size_t)in_stack_fffffffffffffea8,in_stack_fffffffffffffef0,in_stack_fffffffffffffef8
               ,(size_t)in_stack_ffffffffffffff00,(size_t)in_stack_ffffffffffffff08,
               (size_t)padding_width);
    in_stack_ffffffffffffff08 = Timer::stop(in_stack_fffffffffffffe80);
    local_c0[0] = in_stack_ffffffffffffff08;
    in_stack_ffffffffffffff00 = std::min<double>(&local_78,local_c0);
    local_78 = *in_stack_ffffffffffffff00;
    local_90[2] = local_90[2] + 1;
  }
  lVar5 = local_38 * local_40 * (long)in_stack_00000008 * (long)in_stack_00000008 * local_20 *
          local_18;
  auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar8._0_8_ = lVar5;
  auVar8._12_4_ = 0x45300000;
  pmVar3 = remora::
           matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_8);
  sVar4 = remora::matrix<float,_remora::row_major,_remora::cpu_tag>::size1(pmVar3);
  auVar9._8_4_ = (int)(sVar4 >> 0x20);
  auVar9._0_8_ = sVar4;
  auVar9._12_4_ = 0x45300000;
  dVar7 = (((auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 0.0009765625 *
          0.0009765625) / local_78;
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_38);
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)in_stack_00000008);
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_20);
  std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<((ostream *)&std::cout,"\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar7);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  remora::matrix<float,_remora::row_major,_remora::cpu_tag>::~matrix
            ((matrix<float,_remora::row_major,_remora::cpu_tag> *)0x10a3c3);
  return;
}

Assistant:

void benchmark(
	matrix_expression<E1, cpu_tag> const& image,
	vector_expression<E2, cpu_tag> const& filter,
	std::size_t num_channels,
	std::size_t num_filters,
	std::size_t image_size1,
	std::size_t image_size2,
	std::size_t filter_size
){
	std::size_t output_size1 = image_size1 - filter_size +1;
	std::size_t output_size2 = image_size2 - filter_size +1;
	typedef typename E1::value_type value_type;

	remora::matrix<value_type> out(image().size1(), output_size1 * num_filters * output_size2, 0.0);
	double minOptTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != std::max<std::size_t>(1, std::size_t(20/image().size1())); ++i){
		Timer time;
		kernels::conv2d(image,filter,out, num_channels, num_filters, image_size1, image_size2, filter_size, filter_size,0,0);
		minOptTime = std::min(minOptTime,time.stop());
	}

	double mults = output_size1 * output_size2 * filter_size * filter_size * num_filters * num_channels;
	double flops = image().size1() * mults /1024/1024/minOptTime;

	std::cout<<output_size1<<"\t"<<filter_size<<"\t"<<num_channels<<"\t"<< num_filters<<"\t";
	std::cout<<"\t"<<flops<< std::endl;
}